

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cpp
# Opt level: O2

Error __thiscall asmjit::_abi_1_10::BaseBuilder::serializeTo(BaseBuilder *this,BaseEmitter *dst)

{
  undefined8 *puVar1;
  NodeFlags NVar2;
  NodeType NVar3;
  byte bVar4;
  uint32_t uVar5;
  char *pcVar6;
  undefined8 uVar7;
  BaseNode *pBVar8;
  Error EVar9;
  Section *pSVar10;
  ulong uVar11;
  Operand_ *pOVar12;
  anon_union_4_5_b2977b59_for_BaseNode_2 *paVar13;
  SectionNode *node;
  BaseNode *pBVar14;
  long lVar15;
  Operand_ *pOVar16;
  undefined4 local_c0;
  undefined4 local_bc;
  undefined8 local_b8;
  BaseBuilder *local_b0;
  undefined4 local_a8;
  undefined4 local_a4;
  undefined8 local_a0;
  Operand_ opArray [6];
  
  pBVar14 = this->_firstNode;
  local_b0 = this;
  do {
    pcVar6 = pBVar14->_inlineComment;
    dst->_inlineComment = pcVar6;
    NVar2 = (pBVar14->field_1)._any._nodeFlags;
    if ((NVar2 & kActsAsInst) != kNone) {
      uVar5 = *(uint32_t *)((long)&pBVar14[1].field_0 + 0xc);
      uVar7 = *(undefined8 *)((long)&pBVar14[1].field_0.field_0._prev + 4);
      dst->_instOptions = (int)uVar7;
      (dst->_extraReg)._signature = (Signature)(int)((ulong)uVar7 >> 0x20);
      (dst->_extraReg)._id = uVar5;
      bVar4 = (pBVar14->field_1)._any._reserved0;
      uVar11 = (ulong)bVar4;
      pOVar16 = (Operand_ *)EmitterUtils::noExt;
      if (3 < uVar11) {
        opArray[3]._signature._bits = *(uint32_t *)&pBVar14[2].field_1;
        opArray[3]._baseId = pBVar14[2]._position;
        opArray[3]._data = *(uint32_t (*) [2])&pBVar14[2].field_3;
        for (lVar15 = 0; (ulong)bVar4 * 0x10 + -0x40 != lVar15; lVar15 = lVar15 + 0x10) {
          puVar1 = (undefined8 *)((long)&pBVar14[2]._passData + lVar15);
          uVar7 = puVar1[1];
          *(undefined8 *)((long)opArray[4]._data + lVar15 + -8) = *puVar1;
          *(undefined8 *)((long)opArray[4]._data + lVar15) = uVar7;
        }
        pOVar12 = opArray + bVar4;
        for (; pOVar16 = opArray + 3, uVar11 < 6; uVar11 = uVar11 + 1) {
          pOVar12->_signature = 0;
          pOVar12->_baseId = 0;
          pOVar12->_data[0] = 0;
          pOVar12->_data[1] = 0;
          pOVar12 = pOVar12 + 1;
        }
      }
      EVar9 = (*dst->_vptr_BaseEmitter[7])
                        (dst,(ulong)*(uint *)&pBVar14[1].field_0,&pBVar14[1].field_1,
                         &pBVar14[1]._passData,pBVar14 + 2,pOVar16);
      goto LAB_001103c4;
    }
    NVar3 = (pBVar14->field_1)._any._nodeType;
    if ((NVar2 & kActsAsLabel) != kNone) {
      if (NVar3 == kConstPool) {
        local_bc = *(undefined4 *)&pBVar14[1].field_0;
        local_c0 = 4;
        local_b8 = 0;
        EVar9 = (*dst->_vptr_BaseEmitter[0xc])
                          (dst,&local_c0,(undefined1 *)((long)&pBVar14[1].field_0 + 8));
      }
      else {
        local_bc = *(undefined4 *)&pBVar14[1].field_0;
        local_c0 = 4;
        local_b8 = 0;
        EVar9 = (*dst->_vptr_BaseEmitter[6])(dst,&local_c0);
      }
      goto LAB_001103c4;
    }
    switch(NVar3) {
    case kSection:
      pSVar10 = CodeHolder::sectionById
                          ((local_b0->super_BaseEmitter)._code,*(uint32_t *)&pBVar14[1].field_0);
      EVar9 = (*dst->_vptr_BaseEmitter[3])(dst,pSVar10);
      break;
    default:
      goto switchD_001102f0_caseD_3;
    case kAlign:
      EVar9 = (*dst->_vptr_BaseEmitter[9])
                        (dst,(ulong)(pBVar14->field_1)._any._reserved0,
                         (ulong)*(uint *)&pBVar14[1].field_0);
      break;
    case kEmbedData:
      pBVar8 = pBVar14[1].field_0.field_0._prev;
      if ((ulong)(pBVar14->field_1)._any._reserved1 * (long)pBVar8 < 0x41) {
        paVar13 = &pBVar14[1].field_1;
      }
      else {
        paVar13 = *(anon_union_4_5_b2977b59_for_BaseNode_2 **)&pBVar14[1].field_1;
      }
      EVar9 = (*dst->_vptr_BaseEmitter[0xb])
                        (dst,(ulong)(pBVar14->field_1)._any._reserved0,paVar13,pBVar8,
                         pBVar14[1].field_0.field_0._next);
      break;
    case kEmbedLabel:
      local_bc = *(undefined4 *)&pBVar14[1].field_0;
      local_c0 = 4;
      local_b8 = 0;
      EVar9 = (*dst->_vptr_BaseEmitter[0xd])
                        (dst,&local_c0,(ulong)*(uint *)((long)&pBVar14[1].field_0 + 4));
      break;
    case kEmbedLabelDelta:
      local_bc = *(undefined4 *)&pBVar14[1].field_0;
      local_c0 = 4;
      local_b8 = 0;
      local_a4 = *(undefined4 *)((long)&pBVar14[1].field_0 + 4);
      local_a0 = 0;
      local_a8 = local_c0;
      EVar9 = (*dst->_vptr_BaseEmitter[0xe])
                        (dst,&local_c0,&local_a8,(ulong)*(uint *)((long)&pBVar14[1].field_0 + 8));
      break;
    case kComment:
      EVar9 = (*dst->_vptr_BaseEmitter[0xf])(dst,pcVar6,0xffffffffffffffff);
    }
LAB_001103c4:
    if (EVar9 != 0) {
      return EVar9;
    }
switchD_001102f0_caseD_3:
    pBVar14 = (pBVar14->field_0).field_0._next;
    if (pBVar14 == (BaseNode *)0x0) {
      return 0;
    }
  } while( true );
}

Assistant:

Error BaseBuilder::serializeTo(BaseEmitter* dst) {
  Error err = kErrorOk;
  BaseNode* node_ = _firstNode;

  Operand_ opArray[Globals::kMaxOpCount];

  do {
    dst->setInlineComment(node_->inlineComment());

    if (node_->isInst()) {
      InstNode* node = node_->as<InstNode>();

      // NOTE: Inlined to remove one additional call per instruction.
      dst->setInstOptions(node->options());
      dst->setExtraReg(node->extraReg());

      const Operand_* op = node->operands();
      const Operand_* opExt = EmitterUtils::noExt;

      uint32_t opCount = node->opCount();
      if (opCount > 3) {
        uint32_t i = 4;
        opArray[3] = op[3];

        while (i < opCount) {
          opArray[i].copyFrom(op[i]);
          i++;
        }
        while (i < Globals::kMaxOpCount) {
          opArray[i].reset();
          i++;
        }
        opExt = opArray + 3;
      }

      err = dst->_emit(node->id(), op[0], op[1], op[2], opExt);
    }
    else if (node_->isLabel()) {
      if (node_->isConstPool()) {
        ConstPoolNode* node = node_->as<ConstPoolNode>();
        err = dst->embedConstPool(node->label(), node->constPool());
      }
      else {
        LabelNode* node = node_->as<LabelNode>();
        err = dst->bind(node->label());
      }
    }
    else if (node_->isAlign()) {
      AlignNode* node = node_->as<AlignNode>();
      err = dst->align(node->alignMode(), node->alignment());
    }
    else if (node_->isEmbedData()) {
      EmbedDataNode* node = node_->as<EmbedDataNode>();
      err = dst->embedDataArray(node->typeId(), node->data(), node->itemCount(), node->repeatCount());
    }
    else if (node_->isEmbedLabel()) {
      EmbedLabelNode* node = node_->as<EmbedLabelNode>();
      err = dst->embedLabel(node->label(), node->dataSize());
    }
    else if (node_->isEmbedLabelDelta()) {
      EmbedLabelDeltaNode* node = node_->as<EmbedLabelDeltaNode>();
      err = dst->embedLabelDelta(node->label(), node->baseLabel(), node->dataSize());
    }
    else if (node_->isSection()) {
      SectionNode* node = node_->as<SectionNode>();
      err = dst->section(_code->sectionById(node->id()));
    }
    else if (node_->isComment()) {
      CommentNode* node = node_->as<CommentNode>();
      err = dst->comment(node->inlineComment());
    }

    if (err) break;
    node_ = node_->next();
  } while (node_);

  return err;
}